

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  FILE *__stream;
  size_t sVar5;
  ostream *poVar6;
  string *psVar7;
  ostream *poVar8;
  pointer *__ptr;
  char *pcVar9;
  long *local_858;
  FileCloser fc;
  string difference;
  uchar buf [2048];
  
  pcVar1 = *argv;
  pcVar4 = strrchr(pcVar1,0x2f);
  pcVar9 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar9 = pcVar1;
  }
  whoami = pcVar9;
  if (argc == 2) {
    iVar3 = strcmp(argv[1],"--version");
    if (iVar3 == 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,pcVar9);
      poVar6 = std::operator<<(poVar8," from qpdf version ");
      psVar7 = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)poVar8);
      poVar8 = std::operator<<(poVar6,psVar7);
      std::endl<char,std::char_traits<char>>(poVar8);
      exit(0);
    }
LAB_001046b7:
    usage();
  }
  else {
    if (argc - 5U < 0xfffffffe) goto LAB_001046b7;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buf,"QPDF_COMPARE_WHY",(allocator<char> *)&difference);
    bVar2 = QUtil::get_env((string *)buf,(string *)0x0);
    std::__cxx11::string::~string((string *)buf);
    pcVar1 = argv[1];
    pcVar9 = argv[2];
    if (argc == 4) {
      pcVar4 = argv[3];
    }
    else {
      pcVar4 = (char *)0x0;
    }
    compare_abi_cxx11_(&difference,pcVar1,pcVar9,pcVar4);
    if ((bVar2 & difference._M_string_length != 0) == 0) {
      if (difference._M_string_length != 0) {
        pcVar9 = pcVar1;
      }
      __stream = (FILE *)QUtil::safe_fopen(pcVar9,"rb");
      fc.f = (FILE *)__stream;
      QUtil::binary_stdout();
      std::make_unique<Pl_StdioFile,char_const(&)[7],_IO_FILE*&>
                ((char (*) [7])&local_858,(_IO_FILE **)"stdout");
      do {
        sVar5 = fread(buf,1,0x800,__stream);
        if (sVar5 == 0) break;
        (**(code **)(*local_858 + 0x10))(local_858,buf,sVar5);
      } while (sVar5 != 0);
      if (difference._M_string_length == 0) {
        if (local_858 != (long *)0x0) {
          (**(code **)(*local_858 + 8))();
        }
        QUtil::FileCloser::~FileCloser(&fc);
        std::__cxx11::string::~string((string *)&difference);
        return 0;
      }
      goto LAB_0010478b;
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cerr,(string *)&difference);
  std::endl<char,std::char_traits<char>>(poVar8);
LAB_0010478b:
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    if ((argc == 2) && (strcmp(argv[1], "--version") == 0)) {
        std::cout << whoami << " from qpdf version " << QPDF::QPDFVersion() << std::endl;
        exit(0);
    }

    if (argc < 3 || argc > 4) {
        usage();
    }

    bool show_why = QUtil::get_env("QPDF_COMPARE_WHY");
    try {
        char const* to_output;
        char const* actual = argv[1];
        char const* expected = argv[2];
        char const* password{nullptr};
        if (argc == 4) {
            password = argv[3];
        }
        auto difference = compare(actual, expected, password);
        if (difference.empty()) {
            // The files are identical; write the expected file. This way, tests can be written
            // that compare the output of this program to the expected file.
            to_output = expected;
        } else {
            if (show_why) {
                std::cerr << difference << std::endl;
                exit(2);
            }
            // The files differ; write the actual file. If it is determined that the actual file
            // is correct because of changes that result in intended differences, this enables
            // the output of this program to replace the expected file in the test suite.
            to_output = actual;
        }
        auto f = QUtil::safe_fopen(to_output, "rb");
        QUtil::FileCloser fc(f);
        QUtil::binary_stdout();
        auto out = std::make_unique<Pl_StdioFile>("stdout", stdout);
        unsigned char buf[2048];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), f);
            if (len <= 0) {
                done = true;
            } else {
                out->write(buf, len);
            }
        }
        if (!difference.empty()) {
            exit(2);
        }
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }
    return 0;
}